

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int mbedtls_x509_crt_info(char *buf,size_t size,char *prefix,mbedtls_x509_crt *crt)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  mbedtls_asn1_sequence *pmVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  mbedtls_x509_sequence *cur;
  mbedtls_asn1_buf *oid;
  char *p;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong __maxlen;
  bool bVar14;
  char *desc;
  char key_size_str [18];
  
  if (crt == (mbedtls_x509_crt *)0x0) {
    uVar2 = snprintf(buf,size,"\nCertificate is uninitialised!\n");
    if (-1 < (int)uVar2) {
      if (uVar2 < size) {
        return uVar2;
      }
      return -0x2980;
    }
  }
  else {
    uVar2 = snprintf(buf,size,"%scert. version     : %d\n",prefix,(ulong)(uint)crt->version);
    if (-1 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
      uVar12 = size - uVar9;
      if (uVar9 <= size && uVar12 != 0) {
        pcVar11 = buf + uVar9;
        uVar2 = snprintf(pcVar11,uVar12,"%sserial number     : ",prefix);
        if (-1 < (int)uVar2) {
          uVar9 = (ulong)uVar2;
          uVar13 = uVar12 - uVar9;
          if (uVar9 <= uVar12 && uVar13 != 0) {
            pcVar11 = pcVar11 + uVar9;
            uVar2 = mbedtls_x509_serial_gets(pcVar11,uVar13,&crt->serial);
            if (-1 < (int)uVar2) {
              uVar9 = (ulong)uVar2;
              uVar12 = uVar13 - uVar9;
              if (uVar9 <= uVar13 && uVar12 != 0) {
                pcVar11 = pcVar11 + uVar9;
                uVar2 = snprintf(pcVar11,uVar12,"\n%sissuer name       : ",prefix);
                if (-1 < (int)uVar2) {
                  uVar9 = (ulong)uVar2;
                  uVar13 = uVar12 - uVar9;
                  if (uVar9 <= uVar12 && uVar13 != 0) {
                    pcVar11 = pcVar11 + uVar9;
                    uVar2 = mbedtls_x509_dn_gets(pcVar11,uVar13,&crt->issuer);
                    if (-1 < (int)uVar2) {
                      uVar9 = (ulong)uVar2;
                      uVar12 = uVar13 - uVar9;
                      if (uVar9 <= uVar13 && uVar12 != 0) {
                        pcVar11 = pcVar11 + uVar9;
                        uVar2 = snprintf(pcVar11,uVar12,"\n%ssubject name      : ",prefix);
                        if (-1 < (int)uVar2) {
                          uVar9 = (ulong)uVar2;
                          uVar13 = uVar12 - uVar9;
                          if (uVar9 <= uVar12 && uVar13 != 0) {
                            pcVar11 = pcVar11 + uVar9;
                            uVar2 = mbedtls_x509_dn_gets(pcVar11,uVar13,&crt->subject);
                            if (-1 < (int)uVar2) {
                              uVar9 = (ulong)uVar2;
                              uVar12 = uVar13 - uVar9;
                              if (uVar9 <= uVar13 && uVar12 != 0) {
                                pcVar11 = pcVar11 + uVar9;
                                uVar2 = snprintf(pcVar11,uVar12,
                                                 "\n%sissued  on        : %04d-%02d-%02d %02d:%02d:%02d"
                                                 ,prefix,(ulong)(uint)(crt->valid_from).year,
                                                 (ulong)(uint)(crt->valid_from).mon,
                                                 (ulong)(uint)(crt->valid_from).day,
                                                 (ulong)(uint)(crt->valid_from).hour,
                                                 (ulong)(uint)(crt->valid_from).min,
                                                 (ulong)(uint)(crt->valid_from).sec);
                                if (-1 < (int)uVar2) {
                                  uVar9 = (ulong)uVar2;
                                  uVar13 = uVar12 - uVar9;
                                  if (uVar9 <= uVar12 && uVar13 != 0) {
                                    pcVar11 = pcVar11 + uVar9;
                                    uVar2 = snprintf(pcVar11,uVar13,
                                                                                                          
                                                  "\n%sexpires on        : %04d-%02d-%02d %02d:%02d:%02d"
                                                  ,prefix,(ulong)(uint)(crt->valid_to).year,
                                                  (ulong)(uint)(crt->valid_to).mon,
                                                  (ulong)(uint)(crt->valid_to).day,
                                                  (ulong)(uint)(crt->valid_to).hour,
                                                  (ulong)(uint)(crt->valid_to).min,
                                                  (ulong)(uint)(crt->valid_to).sec);
                                    if (-1 < (int)uVar2) {
                                      uVar9 = (ulong)uVar2;
                                      uVar12 = uVar13 - uVar9;
                                      if (uVar9 <= uVar13 && uVar12 != 0) {
                                        pcVar11 = pcVar11 + uVar9;
                                        uVar2 = snprintf(pcVar11,uVar12,"\n%ssigned using      : ",
                                                         prefix);
                                        if (-1 < (int)uVar2) {
                                          uVar9 = (ulong)uVar2;
                                          uVar13 = uVar12 - uVar9;
                                          if (uVar9 <= uVar12 && uVar13 != 0) {
                                            pcVar11 = pcVar11 + uVar9;
                                            uVar2 = mbedtls_x509_sig_alg_gets
                                                              (pcVar11,uVar13,&crt->sig_oid,
                                                               crt->sig_pk,crt->sig_md,crt->sig_opts
                                                              );
                                            if (-1 < (int)uVar2) {
                                              uVar9 = (ulong)uVar2;
                                              uVar12 = uVar13 - uVar9;
                                              if (uVar9 <= uVar13 && uVar12 != 0) {
                                                pcVar5 = mbedtls_pk_get_name(&crt->pk);
                                                iVar3 = mbedtls_x509_key_size_helper
                                                                  (key_size_str,0x12,pcVar5);
                                                if (iVar3 != 0) {
                                                  return iVar3;
                                                }
                                                sVar6 = mbedtls_pk_get_bitlen(&crt->pk);
                                                uVar2 = snprintf(pcVar11 + uVar9,uVar12,
                                                                 "\n%s%-18s: %d bits",prefix,
                                                                 key_size_str,sVar6 & 0xffffffff);
                                                if (-1 < (int)uVar2) {
                                                  uVar13 = (ulong)uVar2;
                                                  __maxlen = uVar12 - uVar13;
                                                  if (uVar13 <= uVar12 && __maxlen != 0) {
                                                    pcVar11 = pcVar11 + uVar9 + uVar13;
                                                    if ((crt->ext_types & 0x100) != 0) {
                                                      pcVar5 = "true";
                                                      if (crt->ca_istrue == 0) {
                                                        pcVar5 = "false";
                                                      }
                                                      uVar2 = snprintf(pcVar11,__maxlen,
                                                                                                                                              
                                                  "\n%sbasic constraints : CA=%s",prefix,pcVar5);
                                                  if ((int)uVar2 < 0) {
                                                    return -0x2980;
                                                  }
                                                  uVar9 = (ulong)uVar2;
                                                  bVar14 = __maxlen < uVar9;
                                                  __maxlen = __maxlen - uVar9;
                                                  if (bVar14 || __maxlen == 0) {
                                                    return -0x2980;
                                                  }
                                                  pcVar11 = pcVar11 + uVar9;
                                                  if (0 < crt->max_pathlen) {
                                                    uVar2 = snprintf(pcVar11,__maxlen,
                                                                     ", max_pathlen=%d",
                                                                     (ulong)(crt->max_pathlen - 1));
                                                    if ((int)uVar2 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar9 = (ulong)uVar2;
                                                    bVar14 = __maxlen < uVar9;
                                                    __maxlen = __maxlen - uVar9;
                                                    if (bVar14 || __maxlen == 0) {
                                                      return -0x2980;
                                                    }
                                                    pcVar11 = pcVar11 + uVar9;
                                                  }
                                                  }
                                                  uVar2 = crt->ext_types;
                                                  if ((uVar2 & 0x20) != 0) {
                                                    uVar2 = snprintf(pcVar11,__maxlen,
                                                                     "\n%ssubject alt name  : ",
                                                                     prefix);
                                                    if ((int)uVar2 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar9 = (ulong)uVar2;
                                                    bVar14 = __maxlen < uVar9;
                                                    __maxlen = __maxlen - uVar9;
                                                    if (bVar14 || __maxlen == 0) {
                                                      return -0x2980;
                                                    }
                                                    pcVar11 = pcVar11 + uVar9;
                                                    pcVar5 = anon_var_dwarf_30461 + 9;
                                                    lVar8 = 0;
                                                    for (pmVar7 = &crt->subject_alt_names;
                                                        pmVar7 != (mbedtls_x509_sequence *)0x0;
                                                        pmVar7 = pmVar7->next) {
                                                      uVar9 = (pmVar7->buf).len + lVar8;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        *pcVar11 = '\0';
                                                        return -0x2980;
                                                      }
                                                      for (lVar10 = 0; lVar8 != lVar10;
                                                          lVar10 = lVar10 + 1) {
                                                        pcVar11[lVar10] = pcVar5[lVar10];
                                                      }
                                                      for (uVar9 = 0; uVar9 < (pmVar7->buf).len;
                                                          uVar9 = uVar9 + 1) {
                                                        pcVar11[uVar9 + lVar10] =
                                                             (pmVar7->buf).p[uVar9];
                                                      }
                                                      pcVar11 = pcVar11 + uVar9 + lVar10;
                                                      pcVar5 = ", ";
                                                      lVar8 = 2;
                                                    }
                                                    *pcVar11 = '\0';
                                                    uVar2 = crt->ext_types;
                                                  }
                                                  if ((uVar2 >> 0x10 & 1) != 0) {
                                                    uVar2 = snprintf(pcVar11,__maxlen,
                                                                     "\n%scert. type        : ",
                                                                     prefix);
                                                    if ((int)uVar2 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar9 = (ulong)uVar2;
                                                    bVar14 = __maxlen < uVar9;
                                                    __maxlen = __maxlen - uVar9;
                                                    if (bVar14 || __maxlen == 0) {
                                                      return -0x2980;
                                                    }
                                                    pcVar11 = pcVar11 + uVar9;
                                                    bVar1 = crt->ns_cert_type;
                                                    if ((char)bVar1 < '\0') {
                                                      uVar2 = snprintf(pcVar11,__maxlen,
                                                                       "%sSSL Client",
                                                                       anon_var_dwarf_30461 + 9);
                                                      if ((int)uVar2 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar2;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    else {
                                                      pcVar5 = anon_var_dwarf_30461 + 9;
                                                    }
                                                    if ((bVar1 & 0x40) != 0) {
                                                      uVar2 = snprintf(pcVar11,__maxlen,
                                                                       "%sSSL Server",pcVar5);
                                                      if ((int)uVar2 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar2;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    if ((bVar1 & 0x20) != 0) {
                                                      uVar2 = snprintf(pcVar11,__maxlen,"%sEmail",
                                                                       pcVar5);
                                                      if ((int)uVar2 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar2;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    if ((bVar1 & 0x10) != 0) {
                                                      uVar2 = snprintf(pcVar11,__maxlen,
                                                                       "%sObject Signing",pcVar5);
                                                      if ((int)uVar2 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar2;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    if ((bVar1 & 8) != 0) {
                                                      uVar2 = snprintf(pcVar11,__maxlen,"%sReserved"
                                                                       ,pcVar5);
                                                      if ((int)uVar2 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar2;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    if ((bVar1 & 4) != 0) {
                                                      uVar2 = snprintf(pcVar11,__maxlen,"%sSSL CA",
                                                                       pcVar5);
                                                      if ((int)uVar2 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar2;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    if ((bVar1 & 2) != 0) {
                                                      uVar2 = snprintf(pcVar11,__maxlen,"%sEmail CA"
                                                                       ,pcVar5);
                                                      if ((int)uVar2 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar2;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    if ((bVar1 & 1) != 0) {
                                                      uVar2 = snprintf(pcVar11,__maxlen,
                                                                       "%sObject Signing CA",pcVar5)
                                                      ;
                                                      if ((int)uVar2 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar2;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                    }
                                                  }
                                                  if ((crt->ext_types & 4) != 0) {
                                                    uVar2 = snprintf(pcVar11,__maxlen,
                                                                     "\n%skey usage         : ",
                                                                     prefix);
                                                    if ((int)uVar2 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar9 = (ulong)uVar2;
                                                    bVar14 = __maxlen < uVar9;
                                                    __maxlen = __maxlen - uVar9;
                                                    if (bVar14 || __maxlen == 0) {
                                                      return -0x2980;
                                                    }
                                                    pcVar11 = pcVar11 + uVar9;
                                                    uVar2 = crt->key_usage;
                                                    if ((char)uVar2 < '\0') {
                                                      uVar4 = snprintf(pcVar11,__maxlen,
                                                                       "%sDigital Signature",
                                                                       anon_var_dwarf_30461 + 9);
                                                      if ((int)uVar4 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar4;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    else {
                                                      pcVar5 = anon_var_dwarf_30461 + 9;
                                                    }
                                                    if ((uVar2 & 0x40) != 0) {
                                                      uVar4 = snprintf(pcVar11,__maxlen,
                                                                       "%sNon Repudiation",pcVar5);
                                                      if ((int)uVar4 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar4;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    if ((uVar2 & 0x20) != 0) {
                                                      uVar4 = snprintf(pcVar11,__maxlen,
                                                                       "%sKey Encipherment",pcVar5);
                                                      if ((int)uVar4 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar4;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    if ((uVar2 & 0x10) != 0) {
                                                      uVar4 = snprintf(pcVar11,__maxlen,
                                                                       "%sData Encipherment",pcVar5)
                                                      ;
                                                      if ((int)uVar4 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar4;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    if ((uVar2 & 8) != 0) {
                                                      uVar4 = snprintf(pcVar11,__maxlen,
                                                                       "%sKey Agreement",pcVar5);
                                                      if ((int)uVar4 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar4;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    if ((uVar2 & 4) != 0) {
                                                      uVar4 = snprintf(pcVar11,__maxlen,
                                                                       "%sKey Cert Sign",pcVar5);
                                                      if ((int)uVar4 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar4;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    if ((uVar2 & 2) != 0) {
                                                      uVar4 = snprintf(pcVar11,__maxlen,"%sCRL Sign"
                                                                       ,pcVar5);
                                                      if ((int)uVar4 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar4;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    if ((uVar2 & 1) != 0) {
                                                      uVar4 = snprintf(pcVar11,__maxlen,
                                                                       "%sEncipher Only",pcVar5);
                                                      if ((int)uVar4 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar4;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                    if ((short)uVar2 < 0) {
                                                      uVar2 = snprintf(pcVar11,__maxlen,
                                                                       "%sDecipher Only",pcVar5);
                                                      if ((int)uVar2 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar2;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                    }
                                                  }
                                                  if ((crt->ext_types & 0x800) != 0) {
                                                    uVar2 = snprintf(pcVar11,__maxlen,
                                                                     "\n%sext key usage     : ",
                                                                     prefix);
                                                    if ((int)uVar2 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar9 = (ulong)uVar2;
                                                    bVar14 = __maxlen < uVar9;
                                                    __maxlen = __maxlen - uVar9;
                                                    if (bVar14 || __maxlen == 0) {
                                                      return -0x2980;
                                                    }
                                                    pcVar11 = pcVar11 + uVar9;
                                                    pcVar5 = anon_var_dwarf_30461 + 9;
                                                    for (oid = &(crt->ext_key_usage).buf;
                                                        oid != (mbedtls_asn1_buf *)0x0;
                                                        oid = *(mbedtls_asn1_buf **)(oid + 1)) {
                                                      iVar3 = mbedtls_oid_get_extended_key_usage
                                                                        (oid,&desc);
                                                      if (iVar3 != 0) {
                                                        desc = "???";
                                                      }
                                                      uVar2 = snprintf(pcVar11,__maxlen,"%s%s",
                                                                       pcVar5,desc);
                                                      if ((int)uVar2 < 0) {
                                                        return -0x2980;
                                                      }
                                                      uVar9 = (ulong)uVar2;
                                                      bVar14 = __maxlen < uVar9;
                                                      __maxlen = __maxlen - uVar9;
                                                      if (bVar14 || __maxlen == 0) {
                                                        return -0x2980;
                                                      }
                                                      pcVar11 = pcVar11 + uVar9;
                                                      pcVar5 = ", ";
                                                    }
                                                  }
                                                  uVar2 = snprintf(pcVar11,__maxlen,
                                                                   anon_var_dwarf_303a5 + 8);
                                                  if (-1 < (int)uVar2) {
                                                    if (uVar2 < __maxlen) {
                                                      return uVar2 + ((int)size - (int)__maxlen);
                                                    }
                                                    return -0x2980;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return -0x2980;
}

Assistant:

int mbedtls_x509_crt_info( char *buf, size_t size, const char *prefix,
                   const mbedtls_x509_crt *crt )
{
    int ret;
    size_t n;
    char *p;
    char key_size_str[BEFORE_COLON];

    p = buf;
    n = size;

    if( NULL == crt )
    {
        ret = mbedtls_snprintf( p, n, "\nCertificate is uninitialised!\n" );
        MBEDTLS_X509_SAFE_SNPRINTF;

        return( (int) ( size - n ) );
    }

    ret = mbedtls_snprintf( p, n, "%scert. version     : %d\n",
                               prefix, crt->version );
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_snprintf( p, n, "%sserial number     : ",
                               prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_serial_gets( p, n, &crt->serial );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%sissuer name       : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets( p, n, &crt->issuer  );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%ssubject name      : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets( p, n, &crt->subject );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%sissued  on        : " \
                   "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                   crt->valid_from.year, crt->valid_from.mon,
                   crt->valid_from.day,  crt->valid_from.hour,
                   crt->valid_from.min,  crt->valid_from.sec );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%sexpires on        : " \
                   "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                   crt->valid_to.year, crt->valid_to.mon,
                   crt->valid_to.day,  crt->valid_to.hour,
                   crt->valid_to.min,  crt->valid_to.sec );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%ssigned using      : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_sig_alg_gets( p, n, &crt->sig_oid, crt->sig_pk,
                             crt->sig_md, crt->sig_opts );
    MBEDTLS_X509_SAFE_SNPRINTF;

    /* Key size */
    if( ( ret = mbedtls_x509_key_size_helper( key_size_str, BEFORE_COLON,
                                      mbedtls_pk_get_name( &crt->pk ) ) ) != 0 )
    {
        return( ret );
    }

    ret = mbedtls_snprintf( p, n, "\n%s%-" BC "s: %d bits", prefix, key_size_str,
                          (int) mbedtls_pk_get_bitlen( &crt->pk ) );
    MBEDTLS_X509_SAFE_SNPRINTF;

    /*
     * Optional extensions
     */

    if( crt->ext_types & MBEDTLS_X509_EXT_BASIC_CONSTRAINTS )
    {
        ret = mbedtls_snprintf( p, n, "\n%sbasic constraints : CA=%s", prefix,
                        crt->ca_istrue ? "true" : "false" );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( crt->max_pathlen > 0 )
        {
            ret = mbedtls_snprintf( p, n, ", max_pathlen=%d", crt->max_pathlen - 1 );
            MBEDTLS_X509_SAFE_SNPRINTF;
        }
    }

    if( crt->ext_types & MBEDTLS_X509_EXT_SUBJECT_ALT_NAME )
    {
        ret = mbedtls_snprintf( p, n, "\n%ssubject alt name  : ", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( ( ret = x509_info_subject_alt_name( &p, &n,
                                            &crt->subject_alt_names ) ) != 0 )
            return( ret );
    }

    if( crt->ext_types & MBEDTLS_X509_EXT_NS_CERT_TYPE )
    {
        ret = mbedtls_snprintf( p, n, "\n%scert. type        : ", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( ( ret = x509_info_cert_type( &p, &n, crt->ns_cert_type ) ) != 0 )
            return( ret );
    }

    if( crt->ext_types & MBEDTLS_X509_EXT_KEY_USAGE )
    {
        ret = mbedtls_snprintf( p, n, "\n%skey usage         : ", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( ( ret = x509_info_key_usage( &p, &n, crt->key_usage ) ) != 0 )
            return( ret );
    }

    if( crt->ext_types & MBEDTLS_X509_EXT_EXTENDED_KEY_USAGE )
    {
        ret = mbedtls_snprintf( p, n, "\n%sext key usage     : ", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( ( ret = x509_info_ext_key_usage( &p, &n,
                                             &crt->ext_key_usage ) ) != 0 )
            return( ret );
    }

    ret = mbedtls_snprintf( p, n, "\n" );
    MBEDTLS_X509_SAFE_SNPRINTF;

    return( (int) ( size - n ) );
}